

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

FT_Error af_latin_hints_detect_features
                   (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  AF_Edge *ppAVar1;
  AF_Edge *ppAVar2;
  FT_Bool top_to_bottom_hinting;
  char cVar3;
  byte bVar4;
  short sVar5;
  AF_StyleMetrics_conflict pAVar6;
  FT_Memory memory;
  AF_ScriptClass pAVar7;
  FT_Long b_;
  AF_Segment pAVar8;
  AF_Edge *ppAVar9;
  ushort uVar10;
  FT_Error FVar11;
  FT_Long FVar12;
  long lVar13;
  FT_Long FVar14;
  long lVar15;
  AF_Edge_conflict pAVar16;
  FT_Long FVar17;
  AF_Edge_conflict pAVar18;
  AF_Edge_conflict pAVar19;
  uint uVar20;
  AF_Segment_conflict pAVar21;
  ushort uVar22;
  ulong uVar23;
  uint uVar24;
  AF_Segment pAVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  AF_Segment_conflict pAVar29;
  AF_Segment_conflict pAVar30;
  AF_Segment *ppAVar31;
  bool bVar32;
  AF_Edge_conflict local_38;
  
  FVar11 = af_latin_hints_compute_segments(hints,dim);
  if (FVar11 != 0) {
    return FVar11;
  }
  af_latin_hints_link_segments(hints,width_count,widths,dim);
  uVar23 = (ulong)dim;
  pAVar6 = hints->metrics;
  pAVar21 = hints->axis[uVar23].segments;
  if (pAVar21 == (AF_Segment_conflict)0x0) {
    pAVar29 = (AF_Segment_conflict)0x0;
  }
  else {
    pAVar29 = pAVar21 + hints->axis[uVar23].num_segments;
  }
  memory = hints->memory;
  pAVar7 = af_script_classes[pAVar6->style_class->script];
  hints->axis[uVar23].num_edges = 0;
  b_ = *(FT_Long *)
        ((long)hints->axis[0].embedded.segments + (ulong)(dim != AF_DIMENSION_HORZ) * 0x10 + -0x68);
  if (dim == AF_DIMENSION_VERT) {
    top_to_bottom_hinting = pAVar7->top_to_bottom_hinting;
  }
  else {
    if (dim == AF_DIMENSION_HORZ) {
      FVar17 = FT_DivFix(0x40,hints->y_scale);
      top_to_bottom_hinting = '\0';
      goto LAB_0022b41b;
    }
    top_to_bottom_hinting = '\0';
  }
  FVar17 = 0;
LAB_0022b41b:
  FVar12 = FT_DivFix(0x20,b_);
  lVar13 = (long)*(int *)((long)pAVar6 + uVar23 * 0x4c90 + 0x1e8) * (long)(int)b_;
  iVar27 = (int)((ulong)(lVar13 + (lVar13 >> 0x3f) + 0x8000) >> 0x10);
  iVar26 = 0x10;
  if (iVar27 < 0x10) {
    iVar26 = iVar27;
  }
  FVar14 = FT_DivFix((long)iVar26,b_);
  lVar13 = FVar17 * 3;
  for (pAVar30 = pAVar21; pAVar30 < pAVar29; pAVar30 = pAVar30 + 1) {
    lVar15 = (long)pAVar30->height;
    if ((FVar17 <= lVar15) && (pAVar30->delta <= FVar12)) {
      cVar3 = pAVar30->dir;
      if ((cVar3 != AF_DIR_NONE) &&
         ((pAVar30->serif == (AF_Segment)0x0 ||
          (lVar13 == lVar15 * 2 || SBORROW8(lVar13,lVar15 * 2) != lVar13 + lVar15 * -2 < 0)))) {
        for (lVar15 = 0; (ulong)hints->axis[uVar23].num_edges * 0x58 - lVar15 != 0;
            lVar15 = lVar15 + 0x58) {
          pAVar16 = hints->axis[uVar23].edges;
          uVar24 = (int)pAVar30->pos - (int)*(short *)((long)&pAVar16->fpos + lVar15);
          uVar20 = -uVar24;
          if (0 < (int)uVar24) {
            uVar20 = uVar24;
          }
          if (((long)((ulong)uVar20 & 0xffff) < FVar14) && ((&pAVar16->dir)[lVar15] == cVar3)) {
            pAVar30->edge_next = *(AF_Segment *)((long)&pAVar16->first + lVar15);
            *(AF_Segment_conflict *)(*(long *)((long)&pAVar16->last + lVar15) + 0x18) = pAVar30;
            *(AF_Segment_conflict *)((long)&pAVar16->last + lVar15) = pAVar30;
            goto LAB_0022b5b5;
          }
        }
        FVar11 = af_axis_hints_new_edge
                           (hints->axis + uVar23,(int)pAVar30->pos,(int)cVar3,top_to_bottom_hinting,
                            memory,&local_38);
        if (FVar11 != 0) {
          return FVar11;
        }
        local_38->link = (AF_Edge)0x0;
        local_38->serif = (AF_Edge)0x0;
        local_38->scale = 0;
        local_38->blue_edge = (AF_Width)0x0;
        *(undefined8 *)&local_38->score = 0;
        local_38->pos = 0;
        local_38->flags = '\0';
        local_38->dir = '\0';
        *(undefined6 *)&local_38->field_0x1a = 0;
        *(undefined8 *)local_38 = 0;
        local_38->opos = 0;
        local_38->first = pAVar30;
        local_38->last = pAVar30;
        local_38->dir = pAVar30->dir;
        sVar5 = pAVar30->pos;
        local_38->fpos = sVar5;
        lVar15 = (long)sVar5 * (long)(int)b_;
        lVar15 = lVar15 + (lVar15 >> 0x3f) + 0x8000 >> 0x10;
        local_38->opos = lVar15;
        local_38->pos = lVar15;
        pAVar30->edge_next = pAVar30;
      }
    }
LAB_0022b5b5:
  }
  for (; pAVar21 < pAVar29; pAVar21 = pAVar21 + 1) {
    if (pAVar21->dir == '\x04') {
      lVar13 = 0;
      do {
        lVar15 = lVar13;
        if ((ulong)hints->axis[uVar23].num_edges * 0x58 + 0x58 == lVar15 + 0x58) goto LAB_0022b611;
        pAVar16 = hints->axis[uVar23].edges;
        iVar26 = (int)pAVar21->pos - (int)*(short *)((long)&pAVar16->fpos + lVar15);
        uVar10 = (ushort)iVar26;
        uVar22 = -uVar10;
        if (0 < iVar26) {
          uVar22 = uVar10;
        }
        lVar13 = lVar15 + 0x58;
      } while (FVar14 <= (long)(ulong)uVar22);
      pAVar21->edge_next = *(AF_Segment *)((long)&pAVar16->first + lVar15);
      *(AF_Segment_conflict *)(*(long *)((long)&pAVar16->last + lVar15) + 0x18) = pAVar21;
      *(AF_Segment_conflict *)((long)&pAVar16->last + lVar15) = pAVar21;
    }
LAB_0022b611:
  }
  pAVar16 = hints->axis[uVar23].edges;
  pAVar19 = pAVar16;
  if (pAVar16 == (AF_Edge_conflict)0x0) {
    pAVar18 = (AF_Edge_conflict)0x0;
  }
  else {
    pAVar18 = pAVar16 + hints->axis[uVar23].num_edges;
  }
  for (; pAVar19 < pAVar18; pAVar19 = pAVar19 + 1) {
    pAVar8 = pAVar19->first;
    pAVar25 = pAVar8;
    if (pAVar8 != (AF_Segment)0x0) {
      do {
        pAVar25->edge = pAVar19;
        ppAVar31 = &pAVar25->edge_next;
        pAVar25 = *ppAVar31;
      } while (*ppAVar31 != pAVar8);
    }
  }
  do {
    if (pAVar18 <= pAVar16) {
      return 0;
    }
    pAVar8 = pAVar16->first;
    ppAVar1 = &pAVar16->link;
    ppAVar2 = &pAVar16->serif;
    iVar26 = 0;
    iVar27 = 0;
    pAVar25 = pAVar8;
    do {
      if ((pAVar25->serif == (AF_Segment)0x0) ||
         (pAVar19 = pAVar25->serif->edge, pAVar19 == (AF_Edge_conflict)0x0)) {
        bVar32 = false;
      }
      else {
        bVar32 = pAVar19 != pAVar16;
      }
      bVar4 = pAVar25->flags;
      if (pAVar25->link == (AF_Segment)0x0) {
        if (bVar32) goto LAB_0022b6bd;
      }
      else if ((bVar32) || (pAVar25->link->edge != (AF_Edge_conflict)0x0)) {
LAB_0022b6bd:
        ppAVar31 = &pAVar25->serif;
        ppAVar9 = ppAVar2;
        if (!bVar32) {
          ppAVar31 = &pAVar25->link;
          ppAVar9 = ppAVar1;
        }
        pAVar19 = *ppAVar9;
        if (pAVar19 == (AF_Edge_conflict)0x0) {
LAB_0022b714:
          pAVar19 = (*ppAVar31)->edge;
        }
        else {
          uVar24 = (int)pAVar16->fpos - (int)pAVar19->fpos;
          uVar20 = -uVar24;
          if (0 < (int)uVar24) {
            uVar20 = uVar24;
          }
          uVar28 = (int)pAVar25->pos - (int)(*ppAVar31)->pos;
          uVar24 = -uVar28;
          if (0 < (int)uVar28) {
            uVar24 = uVar28;
          }
          if ((uVar24 & 0xffff) < (uVar20 & 0xffff)) goto LAB_0022b714;
        }
        if (bVar32) {
          *ppAVar2 = pAVar19;
          pAVar19->flags = pAVar19->flags | 2;
        }
        else {
          *ppAVar1 = pAVar19;
        }
      }
      uVar20 = bVar4 & 1;
      iVar26 = iVar26 + uVar20;
      iVar27 = iVar27 + (uint)(byte)((byte)uVar20 ^ 1);
      pAVar25 = pAVar25->edge_next;
    } while (pAVar25 != pAVar8);
    pAVar16->flags = iVar27 <= iVar26 && 0 < iVar26;
    if ((pAVar16->serif != (AF_Edge)0x0) && (*ppAVar1 != (AF_Edge)0x0)) {
      *ppAVar2 = (AF_Edge)0x0;
    }
    pAVar16 = pAVar16 + 1;
  } while( true );
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_detect_features( AF_GlyphHints  hints,
                                  FT_UInt        width_count,
                                  AF_WidthRec*   widths,
                                  AF_Dimension   dim )
  {
    FT_Error  error;


    error = af_latin_hints_compute_segments( hints, dim );
    if ( !error )
    {
      af_latin_hints_link_segments( hints, width_count, widths, dim );

      error = af_latin_hints_compute_edges( hints, dim );
    }

    return error;
  }